

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O2

int nacm_cardinality(lys_ext_instance *ext)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  lys_ext_instance *plVar5;
  int iVar6;
  void *__ptr;
  byte bVar7;
  ulong uVar8;
  
  uVar3._0_2_ = ext->flags;
  uVar3._2_1_ = ext->ext_size;
  uVar3._3_1_ = ext->insubstmt_index;
  if ((uVar3 >> 8 & 1) == 0) {
    lVar4 = *(long *)((long)ext->parent + 0x20);
    bVar2 = *(byte *)((long)ext->parent + 0x1a);
    bVar7 = 0;
    for (uVar8 = 0; bVar2 != uVar8; uVar8 = uVar8 + 1) {
      plVar5 = *(lys_ext_instance **)(lVar4 + uVar8 * 8);
      if (plVar5->def == ext->def) {
        if (plVar5 != ext) {
          pbVar1 = (byte *)((long)&plVar5->flags + 1);
          *pbVar1 = *pbVar1 | 1;
        }
        bVar7 = bVar7 + 1;
      }
    }
    iVar6 = 0;
    if (1 < bVar7) {
      __ptr = (void *)lys_path();
      lyext_log(0,"NACM","nacm_cardinality",
                "Extension nacm:%s can appear only once, but %d instances found in %s.",
                ext->def->name,bVar7,__ptr);
      free(__ptr);
      iVar6 = 1;
    }
  }
  else {
    ext->flags = (undefined2)uVar3 & 0xfeff;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
nacm_cardinality(struct lys_ext_instance *ext)
{
    struct lys_ext_instance **extlist;
    uint8_t extsize, i, c;
    char *path;

    if (ext->flags & LYEXT_OPT_PLUGIN1) {
        /* already checked */
        ext->flags &= ~LYEXT_OPT_PLUGIN1;
        return 0;
    }

    extlist = ((struct lys_node *)ext->parent)->ext;
    extsize = ((struct lys_node *)ext->parent)->ext_size;

    for (i = c = 0; i < extsize; i++) {
        if (extlist[i]->def == ext->def) {
            /* note, that it is not necessary to check also ext->insubstmt since
             * nacm_position() ensures that NACM's extension instances are placed only
             * in schema nodes */
            if (extlist[i] != ext) {
                /* do not mark the instance being checked */
                extlist[i]->flags |= LYEXT_OPT_PLUGIN1;
            }
            c++;
        }
    }

    if (c > 1) {
        path = lys_path((struct lys_node *)(ext->parent));
        LYEXT_LOG(LY_LLERR, "NACM", "Extension nacm:%s can appear only once, but %d instances found in %s.",
                  ext->def->name, c, path);
        free(path);
        return 1;
    } else {
        return 0;
    }
}